

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<unsigned_char,false>
               (char *buf,idx_t len,uchar *result,bool strict)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  char *pcVar7;
  ulong uVar8;
  byte bVar9;
  ushort uVar10;
  duckdb *pdVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int16_t local_5a;
  IntegerDecimalCastData<unsigned_char> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar5 = buf[uVar3];
    if ((4 < bVar5 - 9) && (bVar5 != 0x20)) {
      if (bVar5 == 0x2d) {
        uVar14 = len - uVar3;
        uVar12 = 1;
        goto LAB_014f2836;
      }
      if (bVar5 == 0x30 && len - 1 != uVar3) {
        bVar13 = buf[uVar3 + 1];
        if (bVar13 < 0x62) {
          if (bVar13 == 0x42) {
LAB_014f2afa:
            uVar12 = ~uVar3 + len;
            if (1 < uVar12) {
              uVar14 = 1;
              bVar5 = 0;
              goto LAB_014f2b15;
            }
            break;
          }
          if (bVar13 == 0x58) {
LAB_014f29e6:
            uVar12 = ~uVar3 + len;
            if (1 < uVar12) {
              uVar14 = 1;
              bVar5 = 0;
              goto LAB_014f2a0c;
            }
            break;
          }
        }
        else {
          if (bVar13 == 0x62) goto LAB_014f2afa;
          if (bVar13 == 0x78) goto LAB_014f29e6;
        }
      }
      uVar14 = len - uVar3;
      uVar12 = (ulong)(bVar5 == 0x2b);
      if (uVar14 <= uVar12) {
        bVar5 = 0;
        uVar19 = 1;
        goto LAB_014f2c12;
      }
      bVar5 = 0;
      uVar8 = uVar12;
      goto LAB_014f28a4;
    }
    uVar3 = uVar3 + 1;
  } while (len != uVar3);
  goto LAB_014f2ccf;
  while (lVar4 = uVar3 + uVar12, uVar12 = uVar12 + 1, buf[lVar4] == '0') {
LAB_014f2836:
    if (uVar14 <= uVar12) {
      if (len - 1 != uVar3) {
        bVar5 = 0;
        uVar12 = 1;
        goto LAB_014f294e;
      }
      break;
    }
  }
  goto LAB_014f2ccf;
  while( true ) {
    bVar5 = (bVar5 * '\n' - bVar13) + 0x30;
    uVar19 = uVar14;
    if (~uVar12 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar12] == '_') {
      if (((len - uVar12) - 2 == uVar3) ||
         (uVar19 = uVar12 + 2, 9 < (byte)(buf[uVar3 + uVar19] - 0x30U))) goto LAB_014f2ccf;
    }
    else {
      uVar19 = uVar12 + 1;
    }
    uVar12 = uVar19;
    if (uVar14 <= uVar19) break;
LAB_014f294e:
    bVar13 = buf[uVar3 + uVar12];
    if (9 < (byte)(bVar13 - 0x30)) {
      uVar8 = uVar12;
      if (bVar13 == 0x2e) {
        uVar8 = uVar12 + 1;
        if (uVar14 <= uVar8) {
          if (uVar12 < 2) goto LAB_014f2ccf;
          goto LAB_014f2c93;
        }
        if ((uVar12 < 2) || (bVar13 = buf[uVar3 + 1 + uVar12], (byte)(bVar13 - 0x30) < 10))
        goto LAB_014f2ccf;
      }
      if ((4 < bVar13 - 9) && (bVar13 != 0x20)) goto LAB_014f2ccf;
      uVar8 = uVar8 + 1;
      uVar19 = uVar8;
      if (uVar8 < uVar14) goto LAB_014f2c65;
      break;
    }
  }
  goto LAB_014f2c8d;
  while (uVar8 = uVar8 + 1, uVar19 = uVar14, uVar14 != uVar8) {
LAB_014f2c65:
    if ((4 < (byte)buf[uVar3 + uVar8] - 9) && (buf[uVar3 + uVar8] != 0x20)) goto LAB_014f2ccf;
  }
LAB_014f2c8d:
  if (1 < uVar19) goto LAB_014f2c93;
  goto LAB_014f2ccf;
  while( true ) {
    uVar8 = uVar12;
    if ((len - uVar14) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar14] == '_') {
        if (((len - uVar14) - 3 == uVar3) || ((buf[uVar3 + 3 + uVar14] & 0xfeU) != 0x30))
        goto LAB_014f2ccf;
        uVar8 = uVar14 + 2;
      }
      else {
        uVar8 = uVar14 + 1;
      }
    }
    uVar14 = uVar8;
    if ((char)bVar5 < '\0') goto LAB_014f2ccf;
    bVar5 = bVar5 * '\x02' | bVar13;
    if (uVar12 <= uVar14) break;
LAB_014f2b15:
    if (buf[uVar3 + 1 + uVar14] == '0') {
      bVar13 = 0;
    }
    else {
      if (buf[uVar3 + 1 + uVar14] != '1') goto LAB_014f2ccf;
      bVar13 = 1;
    }
  }
  goto LAB_014f2c93;
  while( true ) {
    uVar14 = uVar8;
    if ((byte)~bVar6 >> 4 < bVar5) goto LAB_014f2ccf;
    bVar5 = bVar6 + bVar5 * '\x10';
    if (uVar12 <= uVar14) break;
LAB_014f2a0c:
    bVar13 = buf[uVar3 + 1 + uVar14];
    bVar9 = bVar13 | 0x20;
    if (0x19 < (byte)(bVar13 + 0xbf)) {
      bVar9 = bVar13;
    }
    bVar13 = bVar9 - 0x30;
    if ((byte)(bVar9 + 0x9f) < 6 || bVar13 < 10) {
      bVar6 = bVar9 + 0xa9;
      if (bVar9 < 0x61) {
        bVar6 = bVar13;
      }
    }
    else {
      bVar6 = bVar13;
      if (5 < (byte)(bVar9 + 0xbf)) goto LAB_014f2ccf;
    }
    uVar8 = uVar12;
    if ((len - uVar14) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar14] == '_') {
        if ((len - uVar14) - 3 == uVar3) goto LAB_014f2ccf;
        uVar8 = uVar14 + 2;
        if ((9 < (byte)(buf[uVar3 + 3 + uVar14] - 0x30U)) &&
           ((uVar15 = (byte)buf[uVar3 + 3 + uVar14] - 0x41, 0x25 < uVar15 ||
            ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0)))) goto LAB_014f2ccf;
      }
      else {
        uVar8 = uVar14 + 1;
      }
    }
  }
  goto LAB_014f2c93;
  while( true ) {
    if ((byte)(0x2f - bVar13) / 10 < bVar5) goto LAB_014f2ccf;
    bVar5 = (bVar13 - 0x30) + bVar5 * '\n';
    uVar19 = uVar14;
    if (~uVar8 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar8] == '_') {
      if (((len - uVar8) - 2 == uVar3) ||
         (uVar8 = uVar8 + 2, 9 < (byte)(buf[uVar3 + uVar8] - 0x30U))) goto LAB_014f2ccf;
    }
    else {
      uVar8 = uVar8 + 1;
    }
    uVar19 = uVar8;
    if (uVar14 <= uVar8) break;
LAB_014f28a4:
    bVar13 = buf[uVar3 + uVar8];
    if (9 < (byte)(bVar13 - 0x30)) {
      uVar19 = uVar8;
      if (bVar13 == 0x2e) {
        uVar19 = uVar8 + 1;
        if (uVar14 <= uVar19) {
          if (uVar8 <= uVar12) goto LAB_014f2ccf;
          break;
        }
        if ((uVar8 <= uVar12) || (bVar13 = buf[uVar3 + 1 + uVar8], (byte)(bVar13 - 0x30) < 10))
        goto LAB_014f2ccf;
      }
      if ((4 < bVar13 - 9) && (bVar13 != 0x20)) goto LAB_014f2ccf;
      uVar8 = uVar19 + 1;
      uVar19 = uVar8;
      if (uVar8 < uVar14) goto LAB_014f2be7;
      break;
    }
  }
  goto LAB_014f2c12;
LAB_014f3117:
  uVar16 = uVar17;
  bVar5 = buf[uVar3 + uVar19];
  bVar13 = bVar5 - 0x30;
  local_38 = uVar18;
  if (9 < bVar13) {
    local_58._16_8_ = uVar16 & 0xffff;
    if (uVar19 <= uVar18 && uVar8 <= uVar14) {
      return false;
    }
LAB_014f3325:
    uVar15 = (uint)bVar5;
    if (bVar5 < 0x20) {
      if (4 < uVar15 - 9) {
        return false;
      }
LAB_014f333b:
      uVar19 = uVar19 + 1;
      uVar20 = uVar19;
      if (uVar19 < uVar12) {
        do {
          if ((4 < (byte)buf[uVar3 + uVar19] - 9) && (buf[uVar3 + uVar19] != 0x20)) {
            return false;
          }
          uVar19 = uVar19 + 1;
          uVar20 = uVar12;
        } while (uVar12 != uVar19);
      }
      goto LAB_014f31e1;
    }
    if ((bVar5 != 0x65) && (uVar15 != 0x45)) {
      if (uVar15 != 0x20) {
        return false;
      }
      goto LAB_014f333b;
    }
    if (uVar19 == uVar14) {
      return false;
    }
    if (uVar12 <= uVar19 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar11 = (duckdb *)(buf + uVar3 + uVar19 + 1);
    pcVar7 = (char *)(~uVar3 + (len - uVar19));
    if (*pdVar11 == (duckdb)0x2d) {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar11,pcVar7,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar7,bVar2);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar11,pcVar7,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar7,bVar2);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_58,local_5a);
    goto LAB_014f30c3;
  }
  uVar17 = uVar16;
  if (local_58.decimal <= (long)(((ulong)bVar13 ^ 0x7ffffffffffffffe) / 10)) {
    uVar15 = uVar15 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar13;
    uVar17 = (ulong)uVar15;
  }
  uVar20 = uVar12;
  local_40 = uVar16;
  if (~uVar19 + len != uVar3) goto code_r0x014f3185;
  goto LAB_014f33d4;
code_r0x014f3185:
  if (buf[uVar3 + 1 + uVar19] == '_') {
    if ((len - uVar19) - 2 == uVar3) {
      return false;
    }
    uVar19 = uVar19 + 2;
    if (9 < (byte)(buf[uVar3 + uVar19] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar19 = uVar19 + 1;
  }
  uVar20 = uVar19;
  if (uVar12 <= uVar19) goto LAB_014f33d4;
  goto LAB_014f3117;
LAB_014f33d4:
  local_58._16_8_ = uVar17 & 0xffff;
LAB_014f33e4:
  if ((uVar8 <= uVar14) && (uVar20 <= uVar18)) {
    return false;
  }
  goto LAB_014f31e1;
LAB_014f3235:
  bVar5 = buf[uVar3 + uVar8];
  bVar13 = bVar5 - 0x30;
  local_40 = uVar19;
  if (9 < bVar13) {
    local_58._18_6_ = 0;
    if (uVar8 <= uVar19 && uVar14 < 2) {
      return false;
    }
LAB_014f341f:
    uVar15 = (uint)bVar5;
    if (0x1f < bVar5) {
      if ((bVar5 != 0x65) && (uVar15 != 0x45)) {
        if (uVar15 != 0x20) {
          return false;
        }
        goto LAB_014f3435;
      }
      if (uVar8 == 1) {
        return false;
      }
      if (uVar12 <= uVar8 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar11 = (duckdb *)(buf + uVar3 + uVar8 + 1);
      pcVar7 = (char *)(~uVar3 + (len - uVar8));
      if (*pdVar11 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar11,pcVar7,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar7,bVar2);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar11,pcVar7,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar7,bVar2);
      }
      if (bVar2 == false) {
        return false;
      }
      bVar2 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_58,local_5a)
      ;
      goto LAB_014f30c3;
    }
    if (4 < uVar15 - 9) {
      return false;
    }
LAB_014f3435:
    uVar8 = uVar8 + 1;
    uVar18 = uVar8;
    if (uVar8 < uVar12) {
      do {
        if ((4 < (byte)buf[uVar3 + uVar8] - 9) && (buf[uVar3 + uVar8] != 0x20)) {
          return false;
        }
        uVar8 = uVar8 + 1;
        uVar18 = uVar12;
      } while (uVar12 != uVar8);
    }
    goto LAB_014f32d5;
  }
  if (local_58.decimal <= (long)(((ulong)bVar13 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar10 + 1;
    local_58.decimal = (ulong)bVar13 + local_58.decimal * 10;
    uVar10 = local_58.decimal_digits;
  }
  uVar18 = uVar12;
  if (~uVar8 + len != uVar3) goto code_r0x014f3288;
  goto LAB_014f34c8;
code_r0x014f3288:
  if (buf[uVar3 + 1 + uVar8] == '_') {
    if ((len - uVar8) - 2 == uVar3) {
      return false;
    }
    uVar8 = uVar8 + 2;
    if (9 < (byte)(buf[uVar3 + uVar8] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar8 = uVar8 + 1;
  }
  uVar18 = uVar8;
  if (uVar12 <= uVar8) goto LAB_014f34c8;
  goto LAB_014f3235;
LAB_014f34c8:
  local_58._18_6_ = 0;
LAB_014f34d8:
  if ((uVar14 < 2) && (uVar18 <= uVar19)) {
    return false;
  }
  goto LAB_014f32d5;
  while (uVar8 = uVar8 + 1, uVar19 = uVar14, uVar14 != uVar8) {
LAB_014f2be7:
    if ((4 < (byte)buf[uVar3 + uVar8] - 9) && (buf[uVar3 + uVar8] != 0x20)) goto LAB_014f2ccf;
  }
LAB_014f2c12:
  if (uVar12 < uVar19) {
LAB_014f2c93:
    *result = bVar5;
    return true;
  }
LAB_014f2ccf:
  uVar3 = 0;
  while ((bVar5 = buf[uVar3], bVar5 - 9 < 5 || (bVar5 == 0x20))) {
    uVar3 = uVar3 + 1;
    if (len == uVar3) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar12 = len - uVar3;
  bVar2 = SUB81(uVar12,0);
  if (bVar5 == 0x2d) {
    lVar4 = 1;
    while (uVar12 + (uVar12 == 0) != lVar4) {
      lVar1 = uVar3 + lVar4;
      lVar4 = lVar4 + 1;
      if (buf[lVar1] != '0') {
        return false;
      }
    }
    if (len - 1 == uVar3) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                (&local_58);
      return false;
    }
    uVar14 = 1;
    local_58.result = 0;
    do {
      bVar5 = buf[uVar3 + uVar14];
      bVar13 = bVar5 - 0x30;
      if (9 < bVar13) {
        uVar8 = uVar14;
        if (bVar5 != 0x2e) goto LAB_014f341f;
        uVar19 = uVar14 + 1;
        uVar18 = uVar19;
        if (uVar12 <= uVar19) goto LAB_014f34d8;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar10 = 0;
        uVar8 = uVar19;
        goto LAB_014f3235;
      }
      uVar8 = (0x8000000000000000 - (ulong)bVar13) / 10;
      if (SBORROW8(local_58.result,-uVar8) != (long)(local_58.result + uVar8) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar13;
      uVar18 = uVar12;
      if (~uVar14 + len == uVar3) break;
      if (buf[uVar3 + 1 + uVar14] == '_') {
        if ((len - uVar14) - 2 == uVar3) {
          return false;
        }
        uVar14 = uVar14 + 2;
        if (9 < (byte)(buf[uVar3 + uVar14] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar14 = uVar14 + 1;
      }
      uVar18 = uVar14;
    } while (uVar14 < uVar12);
LAB_014f32d5:
    bVar2 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_58);
    if (!bVar2) {
      return false;
    }
    if (uVar18 < 2) {
      return false;
    }
    goto LAB_014f32f5;
  }
  if (bVar5 == 0x30 && len - 1 != uVar3) {
    bVar13 = buf[uVar3 + 1];
    if (bVar13 < 0x62) {
      if (bVar13 == 0x42) {
LAB_014f3026:
        uVar12 = ~uVar3 + len;
        if (uVar12 < 2) goto LAB_014f30cc;
        uVar14 = 1;
        local_58.result = 0;
        do {
          lVar4 = 0;
          if (buf[uVar3 + 1 + uVar14] != '0') {
            if (buf[uVar3 + 1 + uVar14] != '1') {
              return false;
            }
            lVar4 = 1;
          }
          uVar8 = uVar12;
          if ((len - uVar14) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar14] == '_') {
              if ((len - uVar14) - 3 == uVar3) {
                return false;
              }
              if ((buf[uVar3 + 3 + uVar14] & 0xfeU) != 0x30) {
                return false;
              }
              uVar8 = uVar14 + 2;
            }
            else {
              uVar8 = uVar14 + 1;
            }
          }
          uVar14 = uVar8;
          if (0x3fffffffffffffff < local_58.result) {
            return false;
          }
          local_58.result = lVar4 + local_58.result * 2;
        } while (uVar14 < uVar12);
      }
      else {
        if (bVar13 != 0x58) goto LAB_014f2d72;
LAB_014f2f05:
        uVar12 = ~uVar3 + len;
        if (uVar12 < 2) goto LAB_014f30cc;
        uVar14 = 1;
        local_58.result = 0;
        do {
          bVar5 = buf[uVar3 + 1 + uVar14];
          bVar13 = bVar5 | 0x20;
          if (0x19 < (byte)(bVar5 + 0xbf)) {
            bVar13 = bVar5;
          }
          bVar5 = bVar13 - 0x30;
          if ((byte)(bVar13 + 0x9f) < 6 || bVar5 < 10) {
            bVar9 = bVar13 + 0xa9;
            if (bVar13 < 0x61) {
              bVar9 = bVar5;
            }
          }
          else {
            bVar9 = bVar5;
            if (5 < (byte)(bVar13 + 0xbf)) {
              return false;
            }
          }
          uVar8 = uVar12;
          if ((len - uVar14) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar14] == '_') {
              if ((len - uVar14) - 3 == uVar3) {
                return false;
              }
              uVar8 = uVar14 + 2;
              if (9 < (byte)(buf[uVar3 + 3 + uVar14] - 0x30U)) {
                uVar15 = (byte)buf[uVar3 + 3 + uVar14] - 0x41;
                if (0x25 < uVar15) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar8 = uVar14 + 1;
            }
          }
          uVar14 = uVar8;
          if ((long)((ulong)(bVar9 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar9;
        } while (uVar14 < uVar12);
      }
      bVar2 = IntegerDecimalCastOperation::
              Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_58);
LAB_014f30c3:
      if (bVar2 == false) {
        return false;
      }
      goto LAB_014f32f5;
    }
    if (bVar13 == 0x62) goto LAB_014f3026;
    if (bVar13 == 0x78) goto LAB_014f2f05;
  }
LAB_014f2d72:
  uVar14 = (ulong)(bVar5 == 0x2b);
  if (uVar12 <= uVar14) {
LAB_014f30cc:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
              (&local_58);
    return false;
  }
  local_58.result = 0;
  uVar8 = uVar14;
  do {
    bVar5 = buf[uVar3 + uVar8];
    bVar13 = bVar5 - 0x30;
    if (9 < bVar13) {
      uVar19 = uVar8;
      if (bVar5 != 0x2e) goto LAB_014f3325;
      uVar18 = uVar8 + 1;
      uVar20 = uVar18;
      if (uVar12 <= uVar18) goto LAB_014f33e4;
      local_58.decimal = 0;
      uVar15 = 0;
      uVar17 = 0;
      uVar19 = uVar18;
      goto LAB_014f3117;
    }
    if ((long)(((ulong)bVar13 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      return false;
    }
    local_58.result = local_58.result * 10 + (ulong)bVar13;
    uVar20 = uVar12;
    if (~uVar8 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar8] == '_') {
      if ((len - uVar8) - 2 == uVar3) {
        return false;
      }
      uVar8 = uVar8 + 2;
      if (9 < (byte)(buf[uVar3 + uVar8] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar8 = uVar8 + 1;
    }
    uVar20 = uVar8;
  } while (uVar8 < uVar12);
LAB_014f31e1:
  bVar2 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    (&local_58);
  if (!bVar2) {
    return false;
  }
  if (uVar20 <= uVar14) {
    return false;
  }
LAB_014f32f5:
  *result = (uchar)local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}